

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

SampledSpectrum *
phyr::SampledSpectrum::getFromSample
          (SampledSpectrum *__return_storage_ptr__,double *lambda,double *v,int n)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> vv;
  vector<double,_std::allocator<double>_> vl;
  allocator_type local_59;
  _Vector_base<double,_std::allocator<double>_> local_58;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  bVar1 = isSampleSpaceSorted(lambda,n);
  if (bVar1) {
    _getFromSample(__return_storage_ptr__,lambda,v,n);
  }
  else {
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_40,lambda,lambda + (long)n + -1,
               (allocator_type *)&local_58);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_58,v,v + (long)n + -1,&local_59);
    sortSampleSpace(local_40._M_impl.super__Vector_impl_data._M_start,
                    local_58._M_impl.super__Vector_impl_data._M_start,n);
    _getFromSample(__return_storage_ptr__,local_40._M_impl.super__Vector_impl_data._M_start,
                   local_58._M_impl.super__Vector_impl_data._M_start,n);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

SampledSpectrum SampledSpectrum::getFromSample(const Real* lambda, const Real* v, int n) {
    // Generate sorted sample space
    if (!isSampleSpaceSorted(lambda, n)) {
        std::vector<Real> vl(&lambda[0], &lambda[n-1]);
        std::vector<Real> vv(&v[0], &v[n-1]);

        sortSampleSpace(&vl[0], &vv[0], n);
        return _getFromSample(&vl[0], &vv[0], n);
    }

    return _getFromSample(lambda, v, n);
}